

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

deque<cs_impl::any,_std::allocator<cs_impl::any>_> * __thiscall
cs_impl::
cni_helper<std::deque<cs_impl::any,std::allocator<cs_impl::any>>(*)(std::__cxx11::string_const&,std::deque<cs_impl::any,std::allocator<cs_impl::any>>const&),std::deque<cs_impl::any,std::allocator<cs_impl::any>>(*)(std::__cxx11::string_const&,std::deque<cs_impl::any,std::allocator<cs_impl::any>>const&)>
::_call<0,1>(cni_helper<std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&),_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
             *this,vector *args,sequence<0,_1> *param_3)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_1;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> *in_RDX;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *in_RSI;
  function<std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
  *in_RDI;
  var *in_stack_00000070;
  var *in_stack_00000080;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  function<std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
  *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *in_stack_ffffffffffffffb0;
  
  this_00 = in_RDI;
  std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::operator[](in_RDX,0);
  __args_1 = try_convert_and_check<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL>
             ::convert(in_stack_00000080);
  std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::operator[](in_RDX,1);
  try_convert_and_check<const_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&,_const_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&,_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>,_1UL>
  ::convert(in_stack_00000070);
  __args = &local_70;
  std::
  function<std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
  ::operator()(this_00,__args,(deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)__args_1);
  type_convertor<std::deque<cs_impl::any,std::allocator<cs_impl::any>>,std::deque<cs_impl::any,std::allocator<cs_impl::any>>>
  ::convert<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>
            ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)__args);
  std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::deque
            (in_RSI,(deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_RDI);
  std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::~deque(in_stack_ffffffffffffffb0);
  return (deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_RDI;
}

Assistant:

_Source_RetT _call(cs::vector &args, const cov::sequence<S...> &) const
		{
			return type_convertor<_Target_RetT, _Source_RetT>::convert(
			           mFunc(try_convert<_Target_ArgsT, _Source_ArgsT, S>::convert(args[S])...));
		}